

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV3MeshWeightsBlock(Parser *this,Mesh *mesh)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  uint *iOut;
  char *pcVar6;
  uint iNumBones;
  uint iNumVertices;
  int local_3c;
  uint local_38;
  uint local_34;
  
  local_34 = 0;
  local_3c = 0;
  local_38 = 0;
LAB_003efb5e:
  pcVar2 = this->filePtr;
  if (*pcVar2 == '*') {
    this->filePtr = pcVar2 + 1;
    iVar4 = strncmp("MESH_NUMVERTEX",pcVar2 + 1,0xe);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0xf];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_003efb87;
      pcVar6 = pcVar2 + 0x10;
      if (bVar1 == 0) {
        pcVar6 = pcVar2 + 0xf;
      }
      this->filePtr = pcVar6;
      iOut = &local_34;
LAB_003efc84:
      ParseLV4MeshLong(this,iOut);
      goto LAB_003efb5e;
    }
LAB_003efb87:
    pcVar2 = this->filePtr;
    iVar4 = strncmp("MESH_NUMBONE",pcVar2,0xc);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0xc];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar6 = pcVar2 + 0xd;
        if (bVar1 == 0) {
          pcVar6 = pcVar2 + 0xc;
        }
        this->filePtr = pcVar6;
        iOut = &local_38;
        goto LAB_003efc84;
      }
    }
    pcVar2 = this->filePtr;
    iVar4 = strncmp("MESH_BONE_LIST",pcVar2,0xe);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0xe];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar6 = pcVar2 + 0xf;
        if (bVar1 == 0) {
          pcVar6 = pcVar2 + 0xe;
        }
        this->filePtr = pcVar6;
        ParseLV4MeshBones(this,local_38,mesh);
        goto LAB_003efb5e;
      }
    }
    pcVar2 = this->filePtr;
    iVar4 = strncmp("MESH_BONE_VERTEX_LIST",pcVar2,0x15);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0x15];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_003efccc;
      pcVar6 = pcVar2 + 0x16;
      if (bVar1 == 0) {
        pcVar6 = pcVar2 + 0x15;
      }
      this->filePtr = pcVar6;
      ParseLV4MeshBonesVertices(this,local_34,mesh);
      goto LAB_003efb5e;
    }
  }
LAB_003efccc:
  pbVar3 = (byte *)this->filePtr;
  bVar1 = *pbVar3;
  uVar5 = (uint)bVar1;
  if (bVar1 == 0x7b) {
    local_3c = local_3c + 1;
  }
  else if (bVar1 == 0x7d) {
    local_3c = local_3c + -1;
    if (local_3c == 0) {
      this->filePtr = (char *)(pbVar3 + 1);
      SkipToNextToken(this);
      return;
    }
  }
  else if (uVar5 == 0) {
    LogError(this,"Encountered unexpected EOL while parsing a *MESH_WEIGHTS chunk (Level 3)");
  }
  if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) && (this->bLastWasEndLine == false))
  {
    this->iLineNumber = this->iLineNumber + 1;
    this->bLastWasEndLine = true;
  }
  else {
    this->bLastWasEndLine = false;
  }
  this->filePtr = (char *)(pbVar3 + 1);
  goto LAB_003efb5e;
}

Assistant:

void Parser::ParseLV3MeshWeightsBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0, iNumBones = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of bone vertices ...
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of bones
            if (TokenMatch(filePtr,"MESH_NUMBONE" ,12))
            {
                ParseLV4MeshLong(iNumBones);
                continue;
            }
            // parse the list of bones
            if (TokenMatch(filePtr,"MESH_BONE_LIST" ,14))
            {
                ParseLV4MeshBones(iNumBones,mesh);
                continue;
            }
            // parse the list of bones vertices
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX_LIST" ,21) )
            {
                ParseLV4MeshBonesVertices(iNumVertices,mesh);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_WEIGHTS");
    }
    return;
}